

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.cpp
# Opt level: O2

void __thiscall Compare::Run(Compare *this,int n,double density)

{
  BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *this_00;
  BitSetImplement<std::bitset<128UL>,_KDefectiveSimple> *this_01;
  BitSetImplement<std::bitset<128UL>,_KDefectiveRDS> *this_02;
  
  this_00 = (BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *)operator_new(0xb8);
  BitSetImplement<std::bitset<128UL>,_KDefectiveBase>::BitSetImplement(this_00,n);
  this->solverBase = this_00;
  this_01 = (BitSetImplement<std::bitset<128UL>,_KDefectiveSimple> *)operator_new(0xb8);
  BitSetImplement<std::bitset<128UL>,_KDefectiveSimple>::BitSetImplement(this_01,n);
  this->solverSimple = this_01;
  this_02 = (BitSetImplement<std::bitset<128UL>,_KDefectiveRDS> *)operator_new(0xd8);
  BitSetImplement<std::bitset<128UL>,_KDefectiveRDS>::BitSetImplement(this_02,n);
  this->solverRDS = this_02;
  GraphGenerator::Generate(&this->super_GraphGenerator,n,density,0.0001);
  buildGraphInSolver(this);
  run(this,n);
  if (this->solverBase != (BitSetImplement<std::bitset<128UL>,_KDefectiveBase> *)0x0) {
    (*(this->solverBase->super_KDefectiveBase)._vptr_KDefectiveBase[0x1e])();
  }
  if (this->solverSimple != (BitSetImplement<std::bitset<128UL>,_KDefectiveSimple> *)0x0) {
    (*(this->solverSimple->super_KDefectiveSimple).super_KDefectiveBase._vptr_KDefectiveBase[0x1e])
              ();
  }
  if (this->solverRDS != (BitSetImplement<std::bitset<128UL>,_KDefectiveRDS> *)0x0) {
    (*(this->solverRDS->super_KDefectiveRDS).super_KDefectiveBase._vptr_KDefectiveBase[0x1e])();
    return;
  }
  return;
}

Assistant:

void Compare::Run(int n, double density) {
	solverBase = new BitSetImplement<bitset<128>, KDefectiveBase>(n);
	solverSimple = new BitSetImplement<bitset<128>, KDefectiveSimple>(n);
	solverRDS = new BitSetImplement<bitset<128>, KDefectiveRDS>(n);

	this -> Generate(n, density, 0.0001);
	this -> buildGraphInSolver();
	this -> run(n);

	delete solverBase;
	delete solverSimple;
	delete solverRDS;
}